

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyVisitor.cpp
# Opt level: O3

void __thiscall OpenMD::LipidHeadVisitor::visit(LipidHeadVisitor *this,RigidBody *rb)

{
  char *pcVar1;
  double dVar2;
  int iVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined8 this_00;
  undefined1 auVar6 [8];
  SnapshotManager *this_01;
  iterator iVar7;
  long lVar8;
  undefined8 *puVar9;
  element_type *peVar10;
  ostream *poVar11;
  uint i;
  uint j;
  long lVar12;
  Vector<double,_3U> result;
  RotMat3x3d rotMatrix;
  SnapshotManager *local_158;
  undefined1 local_148 [76];
  int local_fc;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  shared_ptr<OpenMD::GenericData> local_e8;
  value_type local_d8;
  size_type local_c8;
  RealType local_c0;
  _func_int **local_b8;
  SnapshotManager *pSStack_b0;
  _Rb_tree_node_base local_a8;
  size_t local_88;
  undefined8 local_78 [9];
  
  local_a8._M_left = (_Base_ptr)0x0;
  local_a8._M_right = (_Base_ptr)0x0;
  local_88 = 0x3ff0000000000000;
  local_78[6] = 0;
  local_78[7] = 0;
  local_78[4] = 0;
  local_78[5] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[8] = 0;
  (*(rb->super_StuntDouble)._vptr_StuntDouble[7])(local_148);
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->lipidHeadName)._M_t,(key_type *)local_148);
  pcVar1 = local_148 + 0x10;
  if ((char *)local_148._0_8_ != pcVar1) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  if ((_Rb_tree_header *)iVar7._M_node == &(this->lipidHeadName)._M_t._M_impl.super__Rb_tree_header)
  {
    return;
  }
  iVar3 = (rb->super_StuntDouble).globalIndex_;
  lVar12 = (long)(rb->super_StuntDouble).localIndex_;
  lVar8 = *(long *)((long)&(((rb->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData).
                           position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                   (rb->super_StuntDouble).storage_);
  puVar9 = (undefined8 *)(lVar8 + lVar12 * 0x18);
  local_a8._0_8_ = *puVar9;
  local_a8._M_parent = (_Base_ptr)puVar9[1];
  local_c0 = *(RealType *)(lVar8 + 0x10 + lVar12 * 0x18);
  StuntDouble::getA((RotMat3x3d *)local_148,&rb->super_StuntDouble);
  lVar8 = 0;
  do {
    *(undefined8 *)((long)local_78 + lVar8 + 0x10) = *(undefined8 *)(local_148 + lVar8 + 0x10);
    uVar4 = *(undefined8 *)(local_148 + lVar8 + 8);
    *(undefined8 *)((long)local_78 + lVar8) = *(undefined8 *)(local_148 + lVar8);
    *(undefined8 *)((long)local_78 + lVar8 + 8) = uVar4;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x48);
  local_148._0_8_ = (pointer)0x0;
  local_148._8_8_ = (SnapshotManager *)0x0;
  local_148._16_8_ = 0;
  puVar9 = local_78;
  lVar8 = 0;
  do {
    dVar2 = *(double *)(local_148 + lVar8 * 8);
    lVar12 = 0;
    do {
      dVar2 = dVar2 + (double)puVar9[lVar12] * (double)(&local_a8._M_left)[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    *(double *)(local_148 + lVar8 * 8) = dVar2;
    lVar8 = lVar8 + 1;
    puVar9 = puVar9 + 3;
  } while (lVar8 != 3);
  local_b8 = (_func_int **)local_148._0_8_;
  pSStack_b0 = (SnapshotManager *)local_148._8_8_;
  local_c8 = local_148._16_8_;
  local_148._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"ATOMDATA","");
  StuntDouble::getPropertyByName((StuntDouble *)local_f8,(string *)rb);
  this_01 = uStack_f0;
  auVar6 = local_f8;
  local_f8 = (undefined1  [8])0x0;
  uStack_f0._0_4_ = otAtom;
  uStack_f0._4_4_ = 0;
  if ((char *)local_148._0_8_ != pcVar1) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  local_fc = iVar3;
  if (auVar6 == (undefined1  [8])0x0) {
    local_148._0_8_ = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::AtomData,std::allocator<OpenMD::AtomData>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8),(AtomData **)local_148,
               (allocator<OpenMD::AtomData> *)local_f8);
  }
  else {
    peVar10 = (element_type *)__dynamic_cast(auVar6,&GenericData::typeinfo,&AtomData::typeinfo,0);
    if (peVar10 != (element_type *)0x0) {
      bVar5 = true;
      if (this_01 == (SnapshotManager *)0x0) {
        local_158 = (SnapshotManager *)0x0;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->atomStorageLayout_ = this_01->atomStorageLayout_ + 1;
          UNLOCK();
        }
        else {
          this_01->atomStorageLayout_ = this_01->atomStorageLayout_ + 1;
        }
        local_158 = this_01;
      }
      goto LAB_0021db88;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"can not get Atom Data from ",0x1b);
    (*(rb->super_StuntDouble)._vptr_StuntDouble[7])(local_148,rb);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)local_148._0_8_,local_148._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    if ((char *)local_148._0_8_ != pcVar1) {
      operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
    }
    local_148._0_8_ = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::AtomData,std::allocator<OpenMD::AtomData>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8),(AtomData **)local_148,
               (allocator<OpenMD::AtomData> *)local_f8);
  }
  local_158 = (SnapshotManager *)local_148._8_8_;
  bVar5 = false;
  peVar10 = (element_type *)local_148._0_8_;
LAB_0021db88:
  local_148._0_8_ = (char *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::AtomInfo,std::allocator<OpenMD::AtomInfo>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8),(AtomInfo **)local_148,
             (allocator<OpenMD::AtomInfo> *)local_f8);
  this_00 = local_148._8_8_;
  uVar4 = local_148._0_8_;
  std::__cxx11::string::_M_replace(local_148._0_8_,0,*(char **)(local_148._0_8_ + 8),0x25bade);
  *(int *)(uVar4 + 0x20) = local_fc;
  *(undefined8 *)(uVar4 + 0x28) = local_a8._0_8_;
  *(_Base_ptr *)(uVar4 + 0x30) = local_a8._M_parent;
  *(RealType *)(uVar4 + 0x38) = local_c0;
  *(_func_int ***)(uVar4 + 0x40) = local_b8;
  *(SnapshotManager **)(uVar4 + 0x48) = pSStack_b0;
  *(size_type *)(uVar4 + 0x50) = local_c8;
  local_d8.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar4;
  local_d8.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00;
  if ((SnapshotManager *)this_00 != (SnapshotManager *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(this_00 + 8) = *(_Atomic_word *)(this_00 + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(this_00 + 8) = *(_Atomic_word *)(this_00 + 8) + 1;
    }
  }
  std::
  vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>::
  push_back((vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
             *)(peVar10 + 1),&local_d8);
  if ((SnapshotManager *)
      local_d8.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (SnapshotManager *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (!bVar5) {
    local_148._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"ATOMDATA","");
    std::__cxx11::string::_M_assign((string *)&peVar10->id_);
    if ((char *)local_148._0_8_ != pcVar1) {
      operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
    }
    local_e8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158;
    if (local_158 != (SnapshotManager *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_158->atomStorageLayout_ = local_158->atomStorageLayout_ + 1;
        UNLOCK();
      }
      else {
        local_158->atomStorageLayout_ = local_158->atomStorageLayout_ + 1;
      }
    }
    local_e8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar10;
    StuntDouble::addProperty(&rb->super_StuntDouble,&local_e8);
    if ((SnapshotManager *)
        local_e8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (SnapshotManager *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if ((SnapshotManager *)this_00 != (SnapshotManager *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  if (local_158 != (SnapshotManager *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158);
  }
  if (this_01 != (SnapshotManager *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
  }
  return;
}

Assistant:

void LipidHeadVisitor::visit(RigidBody* rb) {
    int globalID;
    Vector3d pos;
    Vector3d u(0, 0, 1);
    Vector3d newVec;
    std::shared_ptr<GenericData> data;
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<AtomInfo> atomInfo;
    bool haveAtomData;
    RotMat3x3d rotMatrix;

    if (!canVisit(rb->getType())) return;

    globalID  = rb->getGlobalIndex();
    pos       = rb->getPos();
    rotMatrix = rb->getA();
    // matVecMul3(rotMatrix, u, newVec);
    newVec = rotMatrix * u;

    data = rb->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) {
        std::cerr << "can not get Atom Data from " << rb->getType()
                  << std::endl;

        atomData     = std::make_shared<AtomData>();
        haveAtomData = false;

      } else
        haveAtomData = true;

    } else {
      atomData     = std::make_shared<AtomData>();
      haveAtomData = false;
    }

    atomInfo               = std::make_shared<AtomInfo>();
    atomInfo->atomTypeName = "X";
    atomInfo->globalID     = globalID;
    atomInfo->pos[0]       = pos[0];
    atomInfo->pos[1]       = pos[1];
    atomInfo->pos[2]       = pos[2];
    atomInfo->vec[0]       = newVec[0];
    atomInfo->vec[1]       = newVec[1];
    atomInfo->vec[2]       = newVec[2];

    atomData->addAtomInfo(atomInfo);

    if (!haveAtomData) {
      atomData->setID("ATOMDATA");
      rb->addProperty(atomData);
    }
  }